

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::list_elem<trompeloeil::side_effect_base<void_()>_>::~list_elem
          (list_elem<trompeloeil::side_effect_base<void_()>_> *this)

{
  char *in_RSI;
  list_elem<trompeloeil::side_effect_base<void_()>_> *this_local;
  
  this->_vptr_list_elem = (_func_int **)&PTR__list_elem_0024d008;
  unlink(this,in_RSI);
  return;
}

Assistant:

virtual
    ~list_elem()
    {
      unlink();
    }